

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void AssertEqD(double a,double b,int line)

{
  ostream *poVar1;
  double extraout_XMM0_Qa;
  int line_local;
  double b_local;
  double a_local;
  
  std::abs(line);
  if (extraout_XMM0_Qa < 0.0001) {
    return;
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,line);
  poVar1 = std::operator<<(poVar1,"] FAIL ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,a);
  poVar1 = std::operator<<(poVar1," != ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,b);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void AssertEqD(double a, double b, int line) {
  if (std::abs(a - b) < 0.0001) {
    // OK
  } else {
    std::cout << line << "] FAIL " << a << " != " << b << std::endl;
    exit(-1);
  }
}